

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_match.c
# Opt level: O2

int match_ref(size_t offset,BOOL caseless,heapframe *F,match_block_8 *mb,size_t *lengthptr)

{
  PCRE2_SPTR8 __s2;
  int iVar1;
  ulong uVar2;
  PCRE2_SPTR8 __s1;
  size_t sVar3;
  
  if ((offset < F->offset_top) && (sVar3 = F->ovector[offset], sVar3 != 0xffffffffffffffff)) {
    __s2 = F->eptr;
    __s1 = mb->start_subject + sVar3;
    sVar3 = F->ovector[offset + 1] - sVar3;
    if (caseless == 0) {
      if (mb->partial == 0) {
        if ((ulong)((long)mb->end_subject - (long)__s2) < sVar3) {
          return 1;
        }
        iVar1 = bcmp(__s1,__s2,sVar3);
        if (iVar1 != 0) {
          return -1;
        }
      }
      else {
        for (uVar2 = 0; sVar3 != uVar2; uVar2 = uVar2 + 1) {
          if (mb->end_subject <= __s2 + uVar2) {
            return 1;
          }
          if (__s1[uVar2] != __s2[uVar2]) {
            return -1;
          }
        }
      }
    }
    else {
      for (uVar2 = 0; sVar3 != uVar2; uVar2 = uVar2 + 1) {
        if (mb->end_subject <= __s2 + uVar2) {
          return 1;
        }
        if (mb->lcc[__s1[uVar2]] != mb->lcc[__s2[uVar2]]) {
          return -1;
        }
      }
    }
  }
  else {
    if ((mb->poptions & 0x200) == 0) {
      return -1;
    }
    sVar3 = 0;
  }
  *lengthptr = sVar3;
  return 0;
}

Assistant:

static int
match_ref(PCRE2_SIZE offset, BOOL caseless, heapframe *F, match_block *mb,
  PCRE2_SIZE *lengthptr)
{
PCRE2_SPTR p;
PCRE2_SIZE length;
PCRE2_SPTR eptr;
PCRE2_SPTR eptr_start;

/* Deal with an unset group. The default is no match, but there is an option to
match an empty string. */

if (offset >= Foffset_top || Fovector[offset] == PCRE2_UNSET)
  {
  if ((mb->poptions & PCRE2_MATCH_UNSET_BACKREF) != 0)
    {
    *lengthptr = 0;
    return 0;      /* Match */
    }
  else return -1;  /* No match */
  }

/* Separate the caseless and UTF cases for speed. */

eptr = eptr_start = Feptr;
p = mb->start_subject + Fovector[offset];
length = Fovector[offset+1] - Fovector[offset];

if (caseless)
  {
#if defined SUPPORT_UNICODE
  BOOL utf = (mb->poptions & PCRE2_UTF) != 0;

  if (utf || (mb->poptions & PCRE2_UCP) != 0)
    {
    PCRE2_SPTR endptr = p + length;

    /* Match characters up to the end of the reference. NOTE: the number of
    code units matched may differ, because in UTF-8 there are some characters
    whose upper and lower case codes have different numbers of bytes. For
    example, U+023A (2 bytes in UTF-8) is the upper case version of U+2C65 (3
    bytes in UTF-8); a sequence of 3 of the former uses 6 bytes, as does a
    sequence of two of the latter. It is important, therefore, to check the
    length along the reference, not along the subject (earlier code did this
    wrong). UCP without uses Unicode properties but without UTF encoding. */

    while (p < endptr)
      {
      uint32_t c, d;
      const ucd_record *ur;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */

      if (utf)
        {
        GETCHARINC(c, eptr);
        GETCHARINC(d, p);
        }
      else
        {
        c = *eptr++;
        d = *p++;
        }

      ur = GET_UCD(d);
      if (c != d && c != (uint32_t)((int)d + ur->other_case))
        {
        const uint32_t *pp = PRIV(ucd_caseless_sets) + ur->caseset;
        for (;;)
          {
          if (c < *pp) return -1;  /* No match */
          if (c == *pp++) break;
          }
        }
      }
    }
  else
#endif

  /* Not in UTF or UCP mode */
    {
    for (; length > 0; length--)
      {
      uint32_t cc, cp;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      cc = UCHAR21TEST(eptr);
      cp = UCHAR21TEST(p);
      if (TABLE_GET(cp, mb->lcc, cp) != TABLE_GET(cc, mb->lcc, cc))
        return -1;  /* No match */
      p++;
      eptr++;
      }
    }
  }

/* In the caseful case, we can just compare the code units, whether or not we
are in UTF and/or UCP mode. When partial matching, we have to do this unit by
unit. */

else
  {
  if (mb->partial != 0)
    {
    for (; length > 0; length--)
      {
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      if (UCHAR21INCTEST(p) != UCHAR21INCTEST(eptr)) return -1;  /* No match */
      }
    }

  /* Not partial matching */

  else
    {
    if ((PCRE2_SIZE)(mb->end_subject - eptr) < length) return 1; /* Partial */
    if (memcmp(p, eptr, CU2BYTES(length)) != 0) return -1;  /* No match */
    eptr += length;
    }
  }

*lengthptr = eptr - eptr_start;
return 0;  /* Match */
}